

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::set_config
          (App *this,string *option_name,string *default_filename,string *help_message,
          bool config_required)

{
  Option *pOVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->config_ptr_ != (Option *)0x0) {
    remove_option(this,this->config_ptr_);
    this->config_ptr_ = (Option *)0x0;
  }
  if (option_name->_M_string_length == 0) {
    pOVar1 = (Option *)0x0;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)option_name);
    pOVar1 = add_option<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_70,help_message);
    this->config_ptr_ = pOVar1;
    ::std::__cxx11::string::~string((string *)&local_70);
    pOVar1 = this->config_ptr_;
    if (config_required) {
      (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
    }
    if (default_filename->_M_string_length != 0) {
      ::std::__cxx11::string::string
                (&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 default_filename);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pOVar1->default_str_,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      pOVar1 = this->config_ptr_;
      pOVar1->force_callback_ = true;
    }
    (pOVar1->super_OptionBase<CLI::Option>).configurable_ = false;
    Option::multi_option_policy(pOVar1,Reverse);
    pOVar1 = this->config_ptr_;
  }
  return pOVar1;
}

Assistant:

CLI11_INLINE Option *App::set_config(std::string option_name,
                                     std::string default_filename,
                                     const std::string &help_message,
                                     bool config_required) {

    // Remove existing config if present
    if(config_ptr_ != nullptr) {
        remove_option(config_ptr_);
        config_ptr_ = nullptr;  // need to remove the config_ptr completely
    }

    // Only add config if option passed
    if(!option_name.empty()) {
        config_ptr_ = add_option(option_name, help_message);
        if(config_required) {
            config_ptr_->required();
        }
        if(!default_filename.empty()) {
            config_ptr_->default_str(std::move(default_filename));
            config_ptr_->force_callback_ = true;
        }
        config_ptr_->configurable(false);
        // set the option to take the last value and reverse given by default
        config_ptr_->multi_option_policy(MultiOptionPolicy::Reverse);
    }

    return config_ptr_;
}